

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O2

void ggml_opt_eval_graph(ggml_opt_context_t opt_ctx,ggml_cgraph *graph,ggml_opt_result *result)

{
  uint uVar1;
  size_type __n;
  ggml_init_params params;
  void *data;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  _Bool _Var2;
  float *pfVar3;
  size_t sVar4;
  ggml_context *ctx;
  ggml_cgraph *graph_00;
  ggml_tensor *pgVar5;
  size_t sVar6;
  char *pcVar7;
  int i_1;
  ulong uVar8;
  int iVar9;
  int i;
  long lVar10;
  ulong uVar11;
  float fVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar13 [16];
  vector<int,_std::allocator<int>_> pred;
  int64_t ncorrect;
  undefined8 uStack_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined8 local_68;
  undefined8 local_58;
  ggml_opt_result *local_40;
  float loss;
  
  if (opt_ctx->gf != graph) {
    (*opt_ctx->get_opt_pars)((ggml_opt_optimizer_params *)&pred,opt_ctx->get_opt_pars_ud);
    if (pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
        _0_4_ <= 0.0) {
      pcVar7 = "opt_pars.adamw.alpha > 0.0f";
      iVar9 = 0x24d;
      goto LAB_0012f019;
    }
    if (pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
        _4_4_ < 0.0) {
      pcVar7 = "opt_pars.adamw.beta1 >= 0.0f";
      iVar9 = 0x24e;
      goto LAB_0012f019;
    }
    if (1.0 < pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start._4_4_) {
      pcVar7 = "opt_pars.adamw.beta1 <= 1.0f";
      iVar9 = 0x24f;
      goto LAB_0012f019;
    }
    if (pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ._0_4_ < 0.0) {
      pcVar7 = "opt_pars.adamw.beta2 >= 0.0f";
      iVar9 = 0x250;
      goto LAB_0012f019;
    }
    if (1.0 < pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish._0_4_) {
      pcVar7 = "opt_pars.adamw.beta2 <= 1.0f";
      iVar9 = 0x251;
      goto LAB_0012f019;
    }
    if (pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
        ._4_4_ < 0.0) {
      pcVar7 = "opt_pars.adamw.eps >= 0.0f";
      iVar9 = 0x252;
      goto LAB_0012f019;
    }
    if (pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ < 0.0) {
      pcVar7 = "opt_pars.adamw.wd >= 0.0f";
      iVar9 = 0x253;
      goto LAB_0012f019;
    }
    if (1.0 < pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage._0_4_) {
      pcVar7 = "opt_pars.adamw.wd <= 1.0f";
      iVar9 = 0x254;
      goto LAB_0012f019;
    }
    fVar12 = powf(pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start._4_4_,(float)opt_ctx->iter);
    local_58 = (ggml_hash_set *)CONCAT44(extraout_XMM0_Db,fVar12);
    fVar12 = powf(pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_finish._0_4_,(float)opt_ctx->iter);
    local_68 = (ggml_opt_context_t)CONCAT44(extraout_XMM0_Db_00,fVar12);
    pfVar3 = ggml_get_data_f32(opt_ctx->adamw_params);
    *pfVar3 = pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start._0_4_;
    pfVar3[1] = pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start._4_4_;
    pfVar3[2] = pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish._0_4_;
    pfVar3[3] = pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish._4_4_;
    pfVar3[4] = pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage._0_4_;
    auVar13._4_4_ = DAT_0014b030._4_4_ - (float)local_68;
    auVar13._0_4_ = (float)DAT_0014b030 - (float)local_58;
    auVar13._8_4_ = DAT_0014b030._8_4_ - local_58._4_4_;
    auVar13._12_4_ = DAT_0014b030._12_4_ - local_68._4_4_;
    auVar13 = divps(_DAT_0014b030,auVar13);
    *(long *)(pfVar3 + 5) = auVar13._0_8_;
  }
  if (graph == (ggml_cgraph *)0x0) {
    pcVar7 = "graph";
    iVar9 = 0x10e;
    goto LAB_0012f019;
  }
  if (opt_ctx->allocated_graph != graph) {
    ggml_backend_sched_reset(opt_ctx->backend_sched);
    sVar4 = ggml_tensor_overhead();
    ggml_free(opt_ctx->ctx_copy);
    uStack_78 = 0;
    local_70 = 1;
    params._17_7_ = uStack_6f;
    params.no_alloc = true;
    params.mem_buffer = (void *)0x0;
    params.mem_size = sVar4 << 0xb;
    ncorrect = sVar4 << 0xb;
    ctx = ggml_init(params);
    opt_ctx->ctx_copy = ctx;
    pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
    _0_4_ = 0.0;
    pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_68 = opt_ctx;
    graph_00 = ggml_new_graph_custom(ctx,(long)graph->size,true);
    for (lVar10 = 0; lVar10 < graph->n_leafs; lVar10 = lVar10 + 1) {
      pgVar5 = map_tensor((map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
                           *)&pred,ctx,graph->leafs[lVar10]);
      ggml_build_forward_expand(graph_00,pgVar5);
    }
    local_40 = result;
    if (graph_00->n_leafs != graph->n_leafs) {
      pcVar7 = "dst->n_leafs == src->n_leafs";
      iVar9 = 0xf8;
LAB_0012ef7a:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,iVar9,"GGML_ASSERT(%s) failed",pcVar7);
    }
    for (lVar10 = 0; uVar1 = graph->n_nodes, lVar10 < (int)uVar1; lVar10 = lVar10 + 1) {
      pgVar5 = map_tensor((map<ggml_tensor_*,_ggml_tensor_*,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
                           *)&pred,ctx,graph->nodes[lVar10]);
      ggml_build_forward_expand(graph_00,pgVar5);
    }
    if (graph_00->n_nodes != uVar1) {
      pcVar7 = "dst->n_nodes == src->n_nodes";
      iVar9 = 0xfc;
      goto LAB_0012ef7a;
    }
    local_58 = &graph->visited_hash_set;
    uVar8 = 0;
    uVar11 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar11 = uVar8;
    }
    for (; uVar11 != uVar8; uVar8 = uVar8 + 1) {
      sVar4 = ggml_hash_find(local_58,graph->nodes[uVar8]);
      sVar6 = ggml_hash_find(&graph_00->visited_hash_set,graph_00->nodes[uVar8]);
      if (sVar4 == 0xffffffffffffffff) {
        iVar9 = 0x101;
        pcVar7 = "igrad_src != GGML_HASHSET_FULL";
LAB_0012ee34:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                   ,iVar9,"GGML_ASSERT(%s) failed",pcVar7);
      }
      if (((graph->visited_hash_set).used[sVar4 >> 5] >> ((uint)sVar4 & 0x1f) & 1) == 0) {
        iVar9 = 0x102;
        pcVar7 = "ggml_bitset_get(src->visited_hash_set.used, igrad_src)";
        goto LAB_0012ee34;
      }
      if (sVar6 == 0xffffffffffffffff) {
        iVar9 = 0x103;
        pcVar7 = "igrad_dst != GGML_HASHSET_FULL";
        goto LAB_0012ee34;
      }
      if (((graph_00->visited_hash_set).used[sVar6 >> 5] >> ((uint)sVar6 & 0x1f) & 1) == 0) {
        iVar9 = 0x104;
        pcVar7 = "ggml_bitset_get(dst->visited_hash_set.used, igrad_dst)";
        goto LAB_0012ee34;
      }
      graph_00->grads[sVar6] = graph->grads[sVar4];
      graph_00->grad_accs[sVar6] = graph->grad_accs[sVar4];
    }
    std::
    _Rb_tree<ggml_tensor_*,_std::pair<ggml_tensor_*const,_ggml_tensor_*>,_std::_Select1st<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
    ::~_Rb_tree((_Rb_tree<ggml_tensor_*,_std::pair<ggml_tensor_*const,_ggml_tensor_*>,_std::_Select1st<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>,_std::less<ggml_tensor_*>,_std::allocator<std::pair<ggml_tensor_*const,_ggml_tensor_*>_>_>
                 *)&pred);
    opt_ctx = local_68;
    local_68->allocated_graph_copy = graph_00;
    ggml_backend_sched_alloc_graph(local_68->backend_sched,graph_00);
    opt_ctx->allocated_graph = graph;
    result = local_40;
  }
  ggml_backend_sched_graph_compute(opt_ctx->backend_sched,opt_ctx->allocated_graph_copy);
  opt_ctx->iter = opt_ctx->iter + (ulong)(opt_ctx->allocated_graph == opt_ctx->gb_opt);
  if (result == (ggml_opt_result *)0x0) {
    return;
  }
  lVar10 = result->ndata;
  if (lVar10 == 0) {
    result->loss_per_datapoint = opt_ctx->loss_per_datapoint;
    result->opt_period = (long)opt_ctx->opt_period;
  }
  else {
    if (result->loss_per_datapoint != opt_ctx->loss_per_datapoint) {
      pcVar7 = "result->loss_per_datapoint == opt_ctx->loss_per_datapoint";
      iVar9 = 0x270;
      goto LAB_0012f019;
    }
    if (result->opt_period != (long)opt_ctx->opt_period) {
      pcVar7 = "result->opt_period == opt_ctx->opt_period";
      iVar9 = 0x271;
      goto LAB_0012f019;
    }
  }
  __n = opt_ctx->outputs->ne[1];
  if (lVar10 == ((long)(result->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(result->loss).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start >> 2) * __n) {
    result->ndata = lVar10 + __n;
    _Var2 = ggml_is_scalar(opt_ctx->loss);
    if (_Var2) {
      pgVar5 = opt_ctx->loss;
      if (pgVar5->type == GGML_TYPE_F32) {
        sVar4 = ggml_nbytes(pgVar5);
        ggml_backend_tensor_get(pgVar5,&loss,0,sVar4);
        std::vector<float,_std::allocator<float>_>::push_back(&result->loss,&loss);
        if (opt_ctx->pred->type == GGML_TYPE_I32) {
          std::vector<int,_std::allocator<int>_>::vector(&pred,__n,(allocator_type *)&ncorrect);
          pgVar5 = opt_ctx->pred;
          data = (void *)CONCAT44(pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_);
          sVar4 = ggml_nbytes(pgVar5);
          ggml_backend_tensor_get(pgVar5,data,0,sVar4);
          __first._M_current._4_4_ =
               pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start._4_4_;
          __first._M_current._0_4_ =
               pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start._0_4_;
          __last._M_current._4_4_ =
               pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish._4_4_;
          __last._M_current._0_4_ =
               pred.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish._0_4_;
          std::vector<int,std::allocator<int>>::
          insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                    ((vector<int,std::allocator<int>> *)&result->pred,
                     (const_iterator)
                     (result->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,__first,__last);
          if ((opt_ctx->labels != (ggml_tensor *)0x0) && (-1 < result->ncorrect)) {
            _Var2 = ggml_is_scalar(opt_ctx->ncorrect);
            if (_Var2) {
              pgVar5 = opt_ctx->ncorrect;
              if (pgVar5->type == GGML_TYPE_I64) {
                sVar4 = ggml_nbytes(pgVar5);
                ggml_backend_tensor_get(pgVar5,&ncorrect,0,sVar4);
                result->ncorrect = result->ncorrect + ncorrect;
                goto LAB_0012ede2;
              }
              pcVar7 = "opt_ctx->ncorrect->type == GGML_TYPE_I64";
              iVar9 = 0x289;
            }
            else {
              pcVar7 = "ggml_is_scalar(opt_ctx->ncorrect)";
              iVar9 = 0x288;
            }
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                       ,iVar9,"GGML_ASSERT(%s) failed",pcVar7);
          }
          result->ncorrect = -1;
LAB_0012ede2:
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&pred.super__Vector_base<int,_std::allocator<int>_>);
          return;
        }
        pcVar7 = "opt_ctx->pred->type == GGML_TYPE_I32";
        iVar9 = 0x27e;
      }
      else {
        pcVar7 = "opt_ctx->loss->type == GGML_TYPE_F32";
        iVar9 = 0x279;
      }
    }
    else {
      pcVar7 = "ggml_is_scalar(opt_ctx->loss)";
      iVar9 = 0x278;
    }
  }
  else {
    pcVar7 = 
    "result->ndata == ndata*int64_t(result->loss.size()) && \"varying batch size not supported\"";
    iVar9 = 0x275;
  }
LAB_0012f019:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
             ,iVar9,"GGML_ASSERT(%s) failed",pcVar7);
}

Assistant:

static void ggml_opt_eval_graph(ggml_opt_context_t opt_ctx, ggml_cgraph * graph, ggml_opt_result * result) {
    if (graph != opt_ctx->gf) {
        struct ggml_opt_optimizer_params opt_pars = opt_ctx->get_opt_pars(opt_ctx->get_opt_pars_ud);

        GGML_ASSERT(opt_pars.adamw.alpha >  0.0f);
        GGML_ASSERT(opt_pars.adamw.beta1 >= 0.0f);
        GGML_ASSERT(opt_pars.adamw.beta1 <= 1.0f);
        GGML_ASSERT(opt_pars.adamw.beta2 >= 0.0f);
        GGML_ASSERT(opt_pars.adamw.beta2 <= 1.0f);
        GGML_ASSERT(opt_pars.adamw.eps   >= 0.0f);
        GGML_ASSERT(opt_pars.adamw.wd    >= 0.0f);
        GGML_ASSERT(opt_pars.adamw.wd    <= 1.0f);

        // beta1, beta2 after applying warmup
        const float beta1h = 1.0f/(1.0f - powf(opt_pars.adamw.beta1, opt_ctx->iter));
        const float beta2h = 1.0f/(1.0f - powf(opt_pars.adamw.beta2, opt_ctx->iter));

        float * adamw_par_data = ggml_get_data_f32(opt_ctx->adamw_params);
        adamw_par_data[0] = opt_pars.adamw.alpha;
        adamw_par_data[1] = opt_pars.adamw.beta1;
        adamw_par_data[2] = opt_pars.adamw.beta2;
        adamw_par_data[3] = opt_pars.adamw.eps;
        adamw_par_data[4] = opt_pars.adamw.wd;
        adamw_par_data[5] = beta1h;
        adamw_par_data[6] = beta2h;
    }

    ggml_opt_alloc_graph(opt_ctx, graph);
    ggml_backend_sched_graph_compute(opt_ctx->backend_sched, opt_ctx->allocated_graph_copy);
    opt_ctx->iter += opt_ctx->allocated_graph == opt_ctx->gb_opt;

    if (!result) {
        return;
    }

    if (result->ndata == 0) {
        result->loss_per_datapoint = opt_ctx->loss_per_datapoint;
        result->opt_period         = opt_ctx->opt_period;
    } else {
        GGML_ASSERT(result->loss_per_datapoint == opt_ctx->loss_per_datapoint);
        GGML_ASSERT(result->opt_period         == opt_ctx->opt_period);
    }

    const int64_t ndata = opt_ctx->outputs->ne[1];
    GGML_ASSERT(result->ndata == ndata*int64_t(result->loss.size()) && "varying batch size not supported");
    result->ndata += ndata;

    GGML_ASSERT(ggml_is_scalar(opt_ctx->loss));
    GGML_ASSERT(opt_ctx->loss->type == GGML_TYPE_F32);
    float loss;
    ggml_backend_tensor_get(opt_ctx->loss, &loss, 0, ggml_nbytes(opt_ctx->loss));
    result->loss.push_back(loss);

    GGML_ASSERT(opt_ctx->pred->type == GGML_TYPE_I32);
    std::vector<int32_t> pred(ndata);
    ggml_backend_tensor_get(opt_ctx->pred, pred.data(), 0, ggml_nbytes(opt_ctx->pred));
    result->pred.insert(result->pred.end(), pred.begin(), pred.end());

    if (!opt_ctx->labels || result->ncorrect < 0) {
        result->ncorrect = -1;
        return;
    }

    GGML_ASSERT(ggml_is_scalar(opt_ctx->ncorrect));
    GGML_ASSERT(opt_ctx->ncorrect->type == GGML_TYPE_I64);
    int64_t ncorrect;
    ggml_backend_tensor_get(opt_ctx->ncorrect, &ncorrect, 0, ggml_nbytes(opt_ctx->ncorrect));
    result->ncorrect += ncorrect;
}